

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_typeof(HSQUIRRELVM v,SQInteger idx)

{
  bool bVar1;
  undefined1 local_38 [8];
  SQObjectPtr res;
  SQObjectPtr *o;
  SQInteger idx_local;
  HSQUIRRELVM v_local;
  
  res.super_SQObject._unVal.pTable = (SQTable *)stack_get(v,idx);
  SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_38);
  bVar1 = SQVM::TypeOf(v,(SQObjectPtr *)res.super_SQObject._unVal.pTable,(SQObjectPtr *)local_38);
  if (bVar1) {
    SQVM::Push(v,(SQObjectPtr *)local_38);
    v_local = (HSQUIRRELVM)0x0;
  }
  else {
    v_local = (HSQUIRRELVM)0xffffffffffffffff;
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_38);
  return (SQRESULT)v_local;
}

Assistant:

SQRESULT sq_typeof(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &o = stack_get(v, idx);
    SQObjectPtr res;
    if(!v->TypeOf(o,res)) {
        return SQ_ERROR;
    }
    v->Push(res);
    return SQ_OK;
}